

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int francis_iter(double *A,int N,double *H)

{
  long lVar1;
  double dVar2;
  int iVar3;
  double *A_00;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int local_34;
  
  uVar14 = (ulong)(uint)N;
  A_00 = (double *)malloc((long)N * (long)N * 8);
  uVar13 = N - 1;
  if (N != 0) {
    uVar6 = 0;
    do {
      H[uVar6] = A[uVar6];
      uVar6 = uVar6 + 1;
    } while (N * N + (uint)(N * N == 0) != uVar6);
  }
  hessenberg(H,N);
  iVar5 = 0;
  if (N < 3) {
LAB_001206d0:
    free(A_00);
    return (int)(iVar5 != N * 0x1e);
  }
  iVar12 = N + 1;
  lVar1 = uVar14 * 8 + 8;
  iVar5 = 0;
LAB_001204cb:
  do {
    dVar2 = H[(long)(int)(uVar13 * iVar12) + -1];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      lVar4 = (long)(int)((uVar13 - 1) * N + uVar13);
      if ((H[lVar4 + -2] == 0.0) && (!NAN(H[lVar4 + -2]))) {
        if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_00120505;
        if ((H[lVar4 + -2] == 0.0) && (!NAN(H[lVar4 + -2]))) {
          uVar13 = uVar13 - 2;
        }
        goto LAB_00120508;
      }
    }
    else {
LAB_00120505:
      uVar13 = uVar13 - 1;
LAB_00120508:
      if (1 < (int)uVar13) goto LAB_001204cb;
    }
    if (0 < (int)uVar13) {
      iVar3 = (uVar13 - 1) * iVar12;
      uVar6 = (ulong)uVar13;
      do {
        if ((long)uVar6 < 2) {
          uVar6 = 0;
          local_34 = 1;
          goto LAB_00120567;
        }
        uVar6 = uVar6 - 1;
        lVar4 = (long)iVar3;
        iVar3 = iVar3 + ~N;
      } while ((H[lVar4 + -1] != 0.0) || (NAN(H[lVar4 + -1])));
      local_34 = (int)uVar6 + 1;
LAB_00120567:
      iVar3 = (int)uVar6;
      if (iVar3 <= (int)uVar13) {
        lVar4 = (long)iVar3;
        pdVar9 = (double *)(lVar1 * lVar4 + (long)H);
        iVar10 = (iVar3 - local_34) + 1;
        do {
          lVar11 = 0;
          do {
            A_00[iVar10 + (int)lVar11] = pdVar9[lVar11];
            lVar11 = lVar11 + 1;
          } while ((uVar13 + 1) - iVar3 != (int)lVar11);
          lVar4 = lVar4 + 1;
          pdVar9 = pdVar9 + uVar14;
          iVar10 = iVar10 + (uVar13 - local_34) + 2;
        } while (uVar13 + 1 != (int)lVar4);
      }
      iVar10 = (uVar13 - iVar3) + 1;
      francisQR(A_00,iVar10);
      if (iVar3 <= (int)uVar13) {
        lVar4 = (long)iVar3;
        pdVar9 = (double *)(lVar1 * lVar4 + (long)H);
        iVar7 = (iVar3 - local_34) + 1;
        do {
          lVar11 = 0;
          do {
            pdVar9[lVar11] = A_00[iVar7 + (int)lVar11];
            lVar11 = lVar11 + 1;
          } while (iVar10 != (int)lVar11);
          lVar4 = lVar4 + 1;
          pdVar9 = pdVar9 + uVar14;
          iVar7 = iVar7 + iVar10;
        } while (uVar13 + 1 != (int)lVar4);
      }
      if (local_34 <= (int)uVar13) {
        lVar4 = (long)iVar3;
        pdVar9 = H + lVar4;
        iVar10 = (iVar3 + 1) * N;
        pdVar8 = H + lVar4 + 1;
        iVar3 = iVar3 * iVar12;
        do {
          if (ABS(pdVar9[iVar10]) <= (ABS(pdVar8[iVar10]) + ABS(H[iVar3])) * 1e-12) {
            pdVar9[iVar10] = 0.0;
          }
          lVar4 = lVar4 + 1;
          pdVar9 = pdVar9 + 1;
          iVar10 = iVar10 + N;
          pdVar8 = pdVar8 + 1;
          iVar3 = iVar3 + iVar12;
        } while (lVar4 < (long)(ulong)uVar13);
      }
      iVar5 = iVar5 + 1;
    }
    if (((int)uVar13 < 2) || (N * 0x1e <= iVar5)) goto LAB_001206d0;
  } while( true );
}

Assistant:

int francis_iter(double *A, int N, double *H) {
	int success,brkpoint;
	int i,j,it,p,q,t,u;
	double *temp;
	success = 0;
	brkpoint = 30 * N;
	it = 0;
	p = N - 1;
	temp = (double*) malloc(sizeof(double) * N * N);
	for(i = 0; i < N*N;++i) {
		H[i] = A[i];
	}
	
	hessenberg(H,N);
	
	while (p > 1 && it < brkpoint) {
		
		while (p > 1 && (H[N*p + p-1] == 0 || H[N*(p-1) + p-2] == 0)) {
			if (H[N*p + p-1] == 0) {
				p--;
			} else if (H[N*(p-1) + p-2] == 0) {
				p=p-2;
			}
		}
		
		if (p > 0) {
			q = p-1;
			while (q > 0 && fabs(H[N*q + q-1]) != 0) {
				q--;
			}
			//printf("%d %d \n",q,p);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					temp[u+j-q] = H[t+j];
				}
			}
			francisQR(temp,p-q+1);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					H[t+j] = temp[u+j-q];
				}
			}
			//mdisplay(H,N,N);
			for(i = q; i <= p-1;++i) {
				if ( fabs(H[(i+1)*N+i]) <= TOL * (fabs(H[i*N+i]) + fabs(H[(i+1)*N+i+1]) ) ) {
					H[(i+1)*N+i] = 0.;
				}
			}
			it++;
			//printf("iter %d \n",it);
		}
	}
	
	if (it == brkpoint) {
		success = 0;
	} else {
		success = 1;
	}
	
	free(temp);
	return success;
}